

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O2

void __thiscall
BitCount_PopCountUChar_Test::BitCount_PopCountUChar_Test(BitCount_PopCountUChar_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0020dd98;
  return;
}

Assistant:

TEST (BitCount, PopCountUChar) {
    std::uint8_t bitmap = 0;
    EXPECT_EQ (0U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xF0;
    EXPECT_EQ (4U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xFF;
    EXPECT_EQ (8U, pstore::bit_count::pop_count (bitmap));
}